

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Window * sqlite3WindowAssemble
                   (Parse *pParse,Window *pWin,ExprList *pPartition,ExprList *pOrderBy,Token *pBase)

{
  Vdbe *pVVar1;
  sqlite3 *in_RCX;
  CollSeq *in_RDX;
  sqlite3 *in_RSI;
  ExprList *in_R8;
  
  if (in_RSI == (sqlite3 *)0x0) {
    sqlite3ExprListDelete(in_RCX,in_R8);
    sqlite3ExprListDelete(in_RCX,in_R8);
  }
  else {
    in_RSI->pDfltColl = in_RDX;
    in_RSI->mutex = (sqlite3_mutex *)in_RCX;
    if (in_R8 != (ExprList *)0x0) {
      pVVar1 = (Vdbe *)sqlite3DbStrNDup(in_RSI,(char *)in_RDX,(u64)in_RCX);
      in_RSI->pVdbe = pVVar1;
    }
  }
  return (Window *)in_RSI;
}

Assistant:

SQLITE_PRIVATE Window *sqlite3WindowAssemble(
  Parse *pParse,
  Window *pWin,
  ExprList *pPartition,
  ExprList *pOrderBy,
  Token *pBase
){
  if( pWin ){
    pWin->pPartition = pPartition;
    pWin->pOrderBy = pOrderBy;
    if( pBase ){
      pWin->zBase = sqlite3DbStrNDup(pParse->db, pBase->z, pBase->n);
    }
  }else{
    sqlite3ExprListDelete(pParse->db, pPartition);
    sqlite3ExprListDelete(pParse->db, pOrderBy);
  }
  return pWin;
}